

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverSearch.c
# Opt level: O3

Msat_Type_t
Msat_SolverSearch(Msat_Solver_t *p,int nConfLimit,int nLearnedLimit,int nBackTrackLimit,
                 Msat_SearchParams_t *pPars)

{
  ABC_INT64_T *pAVar1;
  uint Lit;
  double *pdVar2;
  float *pfVar3;
  Msat_IntVec_t *pMVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  Msat_Clause_t *pC;
  Msat_Clause_t **ppMVar11;
  int *piVar12;
  int iVar13;
  Msat_Type_t MVar14;
  long lVar15;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  float fVar19;
  double dVar20;
  uint local_68;
  Msat_Clause_t *local_38;
  
  iVar6 = Msat_SolverReadDecisionLevel(p);
  if (iVar6 != p->nLevelRoot) {
    __assert_fail("Msat_SolverReadDecisionLevel(p) == p->nLevelRoot",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/msat/msatSolverSearch.c"
                  ,0x21e,
                  "Msat_Type_t Msat_SolverSearch(Msat_Solver_t *, int, int, int, Msat_SearchParams_t *)"
                 );
  }
  (p->Stats).nStarts = (p->Stats).nStarts + 1;
  p->dVarDecay = 1.0 / pPars->dVarDecay;
  p->dClaDecay = 1.0 / pPars->dClaDecay;
  iVar6 = p->nVars;
  if (0 < (long)iVar6) {
    pdVar2 = p->pdActivity;
    pfVar3 = p->pFactors;
    lVar15 = 0;
    do {
      pdVar2[lVar15] = (double)pfVar3[lVar15];
      lVar15 = lVar15 + 1;
    } while (iVar6 != lVar15);
  }
  iVar6 = 0;
  do {
    while (pC = Msat_SolverPropagate(p), pC == (Msat_Clause_t *)0x0) {
      Msat_IntVecReadSize(p->vTrailLim);
      iVar7 = Msat_IntVecReadSize(p->vTrail);
      if ((-1 < nLearnedLimit) &&
         (iVar8 = Msat_ClauseVecReadSize(p->vLearned), iVar7 + nLearnedLimit <= iVar8)) {
        dVar20 = p->dClaInc;
        iVar7 = Msat_ClauseVecReadSize(p->vLearned);
        Msat_SolverSortDB(p);
        uVar9 = Msat_ClauseVecReadSize(p->vLearned);
        ppMVar11 = Msat_ClauseVecReadArray(p->vLearned);
        iVar8 = 0;
        uVar17 = 0;
        if (1 < (int)uVar9) {
          uVar17 = (ulong)(uint)((int)uVar9 / 2);
          uVar18 = 0;
          iVar8 = 0;
          do {
            iVar10 = Msat_ClauseIsLocked(p,ppMVar11[uVar18]);
            if (iVar10 == 0) {
              Msat_ClauseFree(p,ppMVar11[uVar18],1);
            }
            else {
              lVar15 = (long)iVar8;
              iVar8 = iVar8 + 1;
              ppMVar11[lVar15] = ppMVar11[uVar18];
            }
            uVar18 = uVar18 + 1;
          } while ((uint)((int)uVar9 / 2) != uVar18);
        }
        if ((int)uVar17 < (int)uVar9) {
          do {
            iVar10 = Msat_ClauseIsLocked(p,ppMVar11[uVar17]);
            if ((iVar10 != 0) ||
               (fVar19 = Msat_ClauseReadActivity(ppMVar11[uVar17]),
               dVar20 / (double)iVar7 <= (double)fVar19)) {
              lVar15 = (long)iVar8;
              iVar8 = iVar8 + 1;
              ppMVar11[lVar15] = ppMVar11[uVar17];
            }
            else {
              Msat_ClauseFree(p,ppMVar11[uVar17],1);
            }
            uVar17 = uVar17 + 1;
          } while (uVar9 != uVar17);
        }
        Msat_ClauseVecShrink(p->vLearned,iVar8);
      }
      iVar7 = Msat_OrderVarSelect(p->pOrder);
      if (iVar7 == -3) {
        memcpy(p->pModel,p->pAssigns,(long)p->nVars << 2);
        MVar14 = MSAT_TRUE;
        goto LAB_0090cc90;
      }
      if (nConfLimit < iVar6 && 0 < nConfLimit) {
        dVar20 = Msat_SolverProgressEstimate(p);
        p->dProgress = dVar20;
LAB_0090cc8e:
        MVar14 = MSAT_UNKNOWN;
LAB_0090cc90:
        Msat_QueueClear(p->pQueue);
        Msat_SolverCancelUntil(p,p->nLevelRoot);
        return MVar14;
      }
      if ((0 < nBackTrackLimit) && (nBackTrackLimit < (int)(p->Stats).nConflicts - p->nBackTracks))
      goto LAB_0090cc8e;
      pAVar1 = &(p->Stats).nDecisions;
      *pAVar1 = *pAVar1 + 1;
      if ((iVar7 < 0) || (p->nVars <= iVar7)) {
        __assert_fail("Var != MSAT_ORDER_UNKNOWN && Var >= 0 && Var < p->nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/msat/msatSolverSearch.c"
                      ,0x26c,
                      "Msat_Type_t Msat_SolverSearch(Msat_Solver_t *, int, int, int, Msat_SearchParams_t *)"
                     );
      }
      iVar7 = Msat_SolverAssume(p,iVar7 * 2);
      if (iVar7 == 0) {
        __assert_fail("Value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/msat/msatSolverSearch.c"
                      ,0x26e,
                      "Msat_Type_t Msat_SolverSearch(Msat_Solver_t *, int, int, int, Msat_SearchParams_t *)"
                     );
      }
    }
    if (p->fVerbose != 0) {
      iVar7 = Msat_SolverReadDecisionLevel(p);
      uVar9 = Msat_SolverReadDecisionLevel(p);
      printf("%-*d**CONFLICT**  ",(ulong)(iVar7 * 3 + 3),(ulong)uVar9);
      Msat_ClausePrintSymbols(pC);
    }
    pAVar1 = &(p->Stats).nConflicts;
    *pAVar1 = *pAVar1 + 1;
    iVar7 = Msat_SolverReadDecisionLevel(p);
    if (iVar7 == p->nLevelRoot) {
      return MSAT_FALSE;
    }
    iVar6 = iVar6 + 1;
    pMVar4 = p->vTemp;
    iVar8 = Msat_IntVecReadSize(p->vTrailLim);
    iVar10 = Msat_IntVecReadSize(p->vTrail);
    iVar10 = iVar10 + -1;
    p->nSeenId = p->nSeenId + 1;
    Msat_IntVecClear(pMVar4);
    Msat_IntVecPush(pMVar4,-1);
    uVar9 = 0xfffffffe;
    local_68 = 0;
    iVar7 = 0;
    do {
      if (pC == (Msat_Clause_t *)0x0) {
        __assert_fail("pC != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/msat/msatSolverSearch.c"
                      ,0x1d6,
                      "void Msat_SolverAnalyze(Msat_Solver_t *, Msat_Clause_t *, Msat_IntVec_t *, int *)"
                     );
      }
      Msat_ClauseCalcReason(p,pC,uVar9,p->vReason);
      uVar9 = Msat_IntVecReadSize(p->vReason);
      piVar12 = Msat_IntVecReadArray(p->vReason);
      iVar13 = iVar10;
      if (0 < (int)uVar9) {
        uVar17 = 0;
        do {
          Lit = piVar12[uVar17];
          iVar13 = (int)Lit >> 1;
          if (p->pSeen[iVar13] != p->nSeenId) {
            p->pSeen[iVar13] = p->nSeenId;
            Msat_SolverVarBumpActivity(p,Lit);
            if (p->pLevel[iVar13] == iVar8) {
              iVar7 = iVar7 + 1;
            }
            else if (0 < p->pLevel[iVar13]) {
              Msat_IntVecPush(pMVar4,Lit ^ 1);
              if ((int)local_68 <= p->pLevel[iVar13]) {
                local_68 = p->pLevel[iVar13];
              }
            }
          }
          uVar17 = uVar17 + 1;
          iVar13 = iVar10;
        } while (uVar9 != uVar17);
      }
      do {
        iVar10 = iVar13 + -1;
        uVar9 = Msat_IntVecReadEntry(p->vTrail,iVar13);
        iVar13 = iVar10;
      } while (p->pSeen[(int)uVar9 >> 1] != p->nSeenId);
      pC = p->pReasons[(int)uVar9 >> 1];
      bVar5 = 1 < iVar7;
      iVar7 = iVar7 + -1;
    } while (bVar5);
    Msat_IntVecWriteEntry(pMVar4,0,uVar9 ^ 1);
    if (p->fVerbose != 0) {
      iVar7 = Msat_SolverReadDecisionLevel(p);
      uVar9 = Msat_SolverReadDecisionLevel(p);
      printf("%-*dLearnt {",(ulong)(iVar7 * 3 + 3),(ulong)uVar9);
      uVar9 = Msat_IntVecReadSize(pMVar4);
      piVar12 = Msat_IntVecReadArray(pMVar4);
      if (0 < (int)uVar9) {
        uVar17 = 0;
        do {
          pcVar16 = "-";
          if ((piVar12[uVar17] & 1U) == 0) {
            pcVar16 = "";
          }
          printf(" %s%d",pcVar16,(ulong)((piVar12[uVar17] >> 1) + 1));
          uVar17 = uVar17 + 1;
        } while (uVar9 != uVar17);
      }
      printf(" } at level %d\n",(ulong)local_68);
    }
    if ((int)local_68 < p->nLevelRoot) {
      local_68 = p->nLevelRoot;
    }
    Msat_SolverCancelUntil(p,local_68);
    pMVar4 = p->vTemp;
    iVar7 = Msat_IntVecReadSize(pMVar4);
    if (iVar7 == 0) {
      __assert_fail("Msat_IntVecReadSize(vLits) != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/msat/msatSolverSearch.c"
                    ,0x96,"Msat_Clause_t *Msat_SolverRecord(Msat_Solver_t *, Msat_IntVec_t *)");
    }
    iVar7 = Msat_ClauseCreate(p,pMVar4,1,&local_38);
    if (iVar7 == 0) {
      __assert_fail("Value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/msat/msatSolverSearch.c"
                    ,0x98,"Msat_Clause_t *Msat_SolverRecord(Msat_Solver_t *, Msat_IntVec_t *)");
    }
    iVar7 = Msat_IntVecReadEntry(pMVar4,0);
    iVar7 = Msat_SolverEnqueue(p,iVar7,local_38);
    if (iVar7 == 0) {
      __assert_fail("Value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/msat/msatSolverSearch.c"
                    ,0x9a,"Msat_Clause_t *Msat_SolverRecord(Msat_Solver_t *, Msat_IntVec_t *)");
    }
    if (local_38 != (Msat_Clause_t *)0x0) {
      Msat_ClauseVecPush(p->vLearned,local_38);
    }
    Msat_SolverVarDecayActivity(p);
    Msat_SolverClaDecayActivity(p);
  } while( true );
}

Assistant:

Msat_Type_t Msat_SolverSearch( Msat_Solver_t * p, int nConfLimit, int nLearnedLimit, int nBackTrackLimit, Msat_SearchParams_t * pPars )
{
    Msat_Clause_t * pConf;
    Msat_Var_t Var;
    int nLevelBack, nConfs, nAssigns, Value;
    int i;

    assert( Msat_SolverReadDecisionLevel(p) == p->nLevelRoot );
    p->Stats.nStarts++;
    p->dVarDecay = 1 / pPars->dVarDecay;
    p->dClaDecay = 1 / pPars->dClaDecay;

    // reset the activities
    for ( i = 0; i < p->nVars; i++ )
       p->pdActivity[i] = (double)p->pFactors[i];
//       p->pdActivity[i] = 0.0;

    nConfs = 0;
    while ( 1 )
    {
        pConf = Msat_SolverPropagate( p );
        if ( pConf != NULL ){
            // CONFLICT
            if ( p->fVerbose )
            {
//                printf(L_IND"**CONFLICT**\n", L_ind);
                printf(L_IND"**CONFLICT**  ", L_ind);
                Msat_ClausePrintSymbols( pConf );
            }
            // count conflicts
            p->Stats.nConflicts++;
            nConfs++;

            // if top level, return UNSAT
            if ( Msat_SolverReadDecisionLevel(p) == p->nLevelRoot )
                return MSAT_FALSE;

            // perform conflict analysis
            Msat_SolverAnalyze( p, pConf, p->vTemp, &nLevelBack );
            Msat_SolverCancelUntil( p, (p->nLevelRoot > nLevelBack)? p->nLevelRoot : nLevelBack );
            Msat_SolverRecord( p, p->vTemp );

            // it is important that recording is done after cancelling
            // because canceling cleans the queue while recording adds to it
            Msat_SolverVarDecayActivity( p );
            Msat_SolverClaDecayActivity( p );

        }
        else{
            // NO CONFLICT
            if ( Msat_IntVecReadSize(p->vTrailLim) == 0 ) {
                // Simplify the set of problem clauses:
//                Value = Msat_SolverSimplifyDB(p);
//                assert( Value );
            }
            nAssigns = Msat_IntVecReadSize( p->vTrail );
            if ( nLearnedLimit >= 0 && Msat_ClauseVecReadSize(p->vLearned) >= nLearnedLimit + nAssigns ) {
                // Reduce the set of learnt clauses:
                Msat_SolverReduceDB(p);
            }

            Var = Msat_OrderVarSelect( p->pOrder );
            if ( Var == MSAT_ORDER_UNKNOWN ) {
                // Model found and stored in p->pAssigns
                memcpy( p->pModel, p->pAssigns, sizeof(int) * p->nVars );
                Msat_QueueClear( p->pQueue );
                Msat_SolverCancelUntil( p, p->nLevelRoot );
                return MSAT_TRUE;
            }
            if ( nConfLimit > 0 && nConfs > nConfLimit ) {
                // Reached bound on number of conflicts:
                p->dProgress = Msat_SolverProgressEstimate( p );
                Msat_QueueClear( p->pQueue );
                Msat_SolverCancelUntil( p, p->nLevelRoot );
                return MSAT_UNKNOWN; 
            }
            else if ( nBackTrackLimit > 0 && (int)p->Stats.nConflicts - p->nBackTracks > nBackTrackLimit ) {
                // Reached bound on number of conflicts:
                Msat_QueueClear( p->pQueue );
                Msat_SolverCancelUntil( p, p->nLevelRoot );
                return MSAT_UNKNOWN; 
            }
            else{
                // New variable decision:
                p->Stats.nDecisions++;
                assert( Var != MSAT_ORDER_UNKNOWN && Var >= 0 && Var < p->nVars );
                Value = Msat_SolverAssume(p, MSAT_VAR2LIT(Var,0) );
                assert( Value );
            }
        }
    }
}